

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void * WindowSettingsHandler_ReadOpen
                 (ImGuiContext *param_1,ImGuiSettingsHandler *param_2,char *name)

{
  ImGuiID IVar1;
  ImGuiWindowSettings *pIVar2;
  
  pIVar2 = ImGui::FindOrCreateWindowSettings(name);
  IVar1 = pIVar2->ID;
  pIVar2->ID = 0;
  (pIVar2->Pos).x = 0;
  (pIVar2->Pos).y = 0;
  *(undefined8 *)&(pIVar2->Pos).y = 0;
  pIVar2->ID = IVar1;
  pIVar2->WantApply = true;
  return pIVar2;
}

Assistant:

static void* WindowSettingsHandler_ReadOpen(ImGuiContext*, ImGuiSettingsHandler*, const char* name)
{
    ImGuiWindowSettings* settings = ImGui::FindOrCreateWindowSettings(name);
    ImGuiID id = settings->ID;
    *settings = ImGuiWindowSettings(); // Clear existing if recycling previous entry
    settings->ID = id;
    settings->WantApply = true;
    return (void*)settings;
}